

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

string * __thiscall
helics::Federate::query_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,string_view queryStr,
          HelicsSequencingModes mode)

{
  long lVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __y._M_str = "name";
  __y._M_len = 4;
  bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y);
  if (bVar3) {
    generateJsonQuotedString(&local_50,&this->mName);
  }
  else {
    __y_00._M_str = "corename";
    __y_00._M_len = 8;
    bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_00);
    if (bVar3) {
      iVar4 = (*((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Core[0xc])();
      generateJsonQuotedString(&local_50,(string *)CONCAT44(extraout_var,iVar4));
    }
    else {
      __y_01._M_str = "time";
      __y_01._M_len = 4;
      bVar3 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)queryStr,__y_01);
      if (bVar3) {
        lVar1 = (this->mCurrentTime).internalTimeCode;
        std::__cxx11::to_string
                  (&local_50,(double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      }
      else {
        (*this->_vptr_Federate[0xe])(&local_50,this,queryStr._M_len,queryStr._M_str);
      }
    }
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (__return_storage_ptr__->_M_string_length == 0) {
    peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Core[0x5e])
              (&local_50,peVar2,(this->mName)._M_string_length,(this->mName)._M_dataplus._M_p,
               queryStr._M_len,queryStr._M_str,mode);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Federate::query(std::string_view queryStr, HelicsSequencingModes mode)
{
    std::string res;
    if (queryStr == "name") {
        res = generateJsonQuotedString(getName());
    } else if (queryStr == "corename") {
        res = generateJsonQuotedString(coreObject->getIdentifier());
    } else if (queryStr == "time") {
        res = std::to_string(mCurrentTime);
    } else {
        res = localQuery(queryStr);
    }
    if (res.empty()) {
        res = coreObject->query(getName(), queryStr, mode);
    }
    return res;
}